

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGUIElement.h
# Opt level: O0

bool __thiscall irr::gui::IGUIElement::isMyChild(IGUIElement *this,IGUIElement *child)

{
  bool local_21;
  IGUIElement *child_local;
  IGUIElement *this_local;
  bool local_1;
  
  child_local = child;
  if (child == (IGUIElement *)0x0) {
    local_1 = false;
  }
  else {
    do {
      if (child_local->Parent != (IGUIElement *)0x0) {
        child_local = child_local->Parent;
      }
      local_21 = child_local->Parent != (IGUIElement *)0x0 && child_local != this;
    } while (local_21);
    local_1 = child_local == this;
  }
  return local_1;
}

Assistant:

bool isMyChild(IGUIElement *child) const
	{
		if (!child)
			return false;
		do {
			if (child->Parent)
				child = child->Parent;

		} while (child->Parent && child != this);

		return child == this;
	}